

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::DoubleParameter::ByteSizeLong(DoubleParameter *this)

{
  AllowedValuesCase AVar1;
  int iVar2;
  size_t sVar3;
  double dVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  DoubleParameter *this_local;
  
  sStack_18 = 0;
  dVar4 = defaultvalue(this);
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    sStack_18 = 9;
  }
  AVar1 = AllowedValues_case(this);
  if ((AVar1 != ALLOWEDVALUES_NOT_SET) && (AVar1 == kRange)) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::DoubleRange>((this->AllowedValues_).range_);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t DoubleParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.DoubleParameter)
  size_t total_size = 0;

  // double defaultValue = 1;
  if (this->defaultvalue() != 0) {
    total_size += 1 + 8;
  }

  switch (AllowedValues_case()) {
    // .CoreML.Specification.DoubleRange range = 10;
    case kRange: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AllowedValues_.range_);
      break;
    }
    case ALLOWEDVALUES_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}